

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildCallCommon
          (IRBuilder *this,Instr *instr,StackSym *symDst,ArgSlot argCount,CallFlags flags)

{
  OpCode OVar1;
  OpCode OVar2;
  Type pIVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  OpndKind OVar8;
  ArgSlot AVar9;
  uint uVar10;
  uint uVar11;
  uint byteCodeOffset;
  undefined4 *puVar12;
  Type *ppIVar13;
  Opnd *pOVar14;
  uint32 uVar15;
  Type pIVar16;
  Func *pFVar17;
  Type pIVar18;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar19;
  uint local_34;
  
  OVar1 = instr->m_opcode;
  pSVar19 = this->m_argStack;
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar19->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar19) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1a7b,"(!m_argStack->Empty())","!m_argStack->Empty()");
    if (!bVar5) goto LAB_004d4cf9;
    *puVar12 = 0;
    pSVar19 = this->m_argStack;
  }
  ppIVar13 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                       (&pSVar19->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  pIVar3 = *ppIVar13;
  SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&pSVar19->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
             pSVar19->allocator);
  pIVar16 = instr;
  if (pIVar3 == (Type)0x0) {
    bVar5 = true;
    local_34 = 0;
    pIVar18 = (Type)0x0;
  }
  else {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_34 = 0;
    do {
      pIVar18 = pIVar3;
      OVar2 = pIVar18->m_opcode;
      if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
          (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
        if (OVar2 != StartCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x1a86,
                             "(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall)",
                             "argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall");
          if (!bVar5) goto LAB_004d4cf9;
          *puVar12 = 0;
        }
        bVar5 = false;
        goto LAB_004d4990;
      }
      bVar5 = OVar2 != StartCall;
      if (OVar2 == StartCall) goto LAB_004d4990;
      pOVar14 = pIVar18->m_dst;
      if (pIVar16->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar6) goto LAB_004d4cf9;
        *puVar12 = 0;
      }
      pFVar17 = pIVar16->m_func;
      if (pOVar14->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar6) goto LAB_004d4cf9;
        *puVar12 = 0;
      }
      bVar7 = pOVar14->field_0xb;
      if ((bVar7 & 2) != 0) {
        pOVar14 = IR::Opnd::Copy(pOVar14,pFVar17);
        bVar7 = pOVar14->field_0xb;
      }
      pOVar14->field_0xb = bVar7 | 2;
      pIVar16->m_src2 = pOVar14;
      local_34 = local_34 + 1;
      pSVar19 = this->m_argStack;
      ppIVar13 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&pSVar19->
                             super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
      pIVar3 = *ppIVar13;
      SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (&pSVar19->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>,
                 pSVar19->allocator);
      pIVar16 = pIVar18;
    } while (pIVar3 != (Type)0x0);
    pIVar18 = (Type)0x0;
  }
LAB_004d4990:
  if ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->m_argStack->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->m_argStack) {
    this->callTreeHasSomeProfileInfo = false;
  }
  uVar10 = OVar1 - 0xc4;
  if (((uVar10 < 6) && ((0x29U >> (uVar10 & 0x1f) & 1) != 0)) || (OVar1 == 0x160)) {
    local_34 = local_34 + 1;
    this->m_argsOnStack = this->m_argsOnStack + 1;
  }
  AVar9 = Js::CallInfo::GetArgCountWithExtraArgs(flags,(uint)argCount);
  uVar10 = (uint)AVar9;
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aa3,"(false)","Expect StartCall on other opcodes...");
joined_r0x004d4c10:
    if (!bVar5) goto LAB_004d4cf9;
    *puVar12 = 0;
  }
  else {
    pOVar14 = pIVar18->m_dst;
    if (pIVar16->m_src2 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_004d4cf9;
      *puVar12 = 0;
    }
    pFVar17 = pIVar16->m_func;
    if (pOVar14->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_004d4cf9;
      *puVar12 = 0;
    }
    bVar7 = pOVar14->field_0xb;
    if ((bVar7 & 2) != 0) {
      pOVar14 = IR::Opnd::Copy(pOVar14,pFVar17);
      bVar7 = pOVar14->field_0xb;
    }
    pOVar14->field_0xb = bVar7 | 2;
    pIVar16->m_src2 = pOVar14;
    if (instr->m_prev->m_opcode != LdSpreadIndices) {
      OVar8 = IR::Opnd::GetKind(pIVar18->m_src1);
      if (OVar8 == OpndKindIntConst) {
        pOVar14 = pIVar18->m_src1;
        OVar8 = IR::Opnd::GetKind(pOVar14);
        if (OVar8 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar5) goto LAB_004d4cf9;
          *puVar12 = 0;
        }
        if ((local_34 == uVar10) && (pOVar14[1]._vptr_Opnd == (_func_int **)(long)(int)local_34))
        goto LAB_004d4c1d;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1a9f,
                         "(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices || (argInstr->GetSrc1()->IsIntConstOpnd() && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count && count == argCount))"
                         ,"StartCall has wrong number of arguments...");
      goto joined_r0x004d4c10;
    }
  }
LAB_004d4c1d:
  uVar15 = this->m_callsOnStack - 1;
  this->m_callsOnStack = uVar15;
  pFVar17 = this->m_func;
  uVar11 = this->m_argsOnStack;
  if (pFVar17->m_argSlotsForFunctionsCalled < uVar11) {
    pFVar17->m_argSlotsForFunctionsCalled = uVar11;
  }
  if (uVar11 != uVar10 && uVar15 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1aaf,"(m_argsOnStack == argCount)","m_argsOnStack == argCount");
    if (!bVar5) {
LAB_004d4cf9:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar12 = 0;
    uVar11 = this->m_argsOnStack;
    pFVar17 = this->m_func;
  }
  this->m_argsOnStack = uVar11 - uVar10;
  bVar5 = Func::IsJitInDebugMode(pFVar17);
  if (bVar5) {
    byteCodeOffset = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
    InsertBailOutForDebugger
              (this,byteCodeOffset,
               BailOutIgnoreException|BailOutStep|BailOutLocalValueChanged|BailOutStackFrameBase|
               BailOutBreakPointInFunction|BailOutForceByFlag,(Instr *)0x0);
    return;
  }
  return;
}

Assistant:

void
IRBuilder::BuildCallCommon(IR::Instr * instr, StackSym * symDst, Js::ArgSlot argCount, Js::CallFlags flags)
{
    Js::OpCode newOpcode = instr->m_opcode;

    IR::Instr *     argInstr = nullptr;
    IR::Instr *     prevInstr = instr;
#if DBG
    int count = 0;
#endif

    // Link all the args of this call by creating a def/use chain through the src2.
    AssertOrFailFast(!m_argStack->Empty());
    for (argInstr = m_argStack->Pop();
        argInstr && !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall;
        argInstr = m_argStack->Pop())
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
#if DBG
        count++;
#endif
    }
    AssertOrFailFast(argInstr == nullptr || argInstr->m_opcode == Js::OpCode::StartCall);

    if (m_argStack->Empty())
    {
        this->callTreeHasSomeProfileInfo = false;
    }

    if (newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjArray
        || newOpcode == Js::OpCode::NewScObjectSpread || newOpcode == Js::OpCode::NewScObjArraySpread)
    {
#if DBG
        count++;
#endif
        m_argsOnStack++;
    }

    argCount = Js::CallInfo::GetArgCountWithExtraArgs(flags, argCount);

    if (argInstr)
    {
        prevInstr->SetSrc2(argInstr->GetDst());
        AssertMsg(instr->m_prev->m_opcode == Js::OpCode::LdSpreadIndices
            // All non-spread calls need StartCall to have the same number of args
            || (argInstr->GetSrc1()->IsIntConstOpnd()
                    && argInstr->GetSrc1()->AsIntConstOpnd()->GetValue() == count
                    && count == argCount), "StartCall has wrong number of arguments...");
    }
    else
    {
        AssertMsg(false, "Expect StartCall on other opcodes...");
    }

    // Update Func if this is the highest amount of stack we've used so far
    // to push args.
#if DBG
    m_callsOnStack--;
#endif
    if (m_func->m_argSlotsForFunctionsCalled < m_argsOnStack)
        m_func->m_argSlotsForFunctionsCalled = m_argsOnStack;
#if DBG
    if (m_callsOnStack == 0)
        Assert(m_argsOnStack == argCount);
#endif
    m_argsOnStack -= argCount;

    if (m_func->IsJitInDebugMode())
    {
        // Insert bailout after return from a call, script or library function call.
        this->InsertBailOutForDebugger(
            m_jnReader.GetCurrentOffset(), // bailout will resume at the offset of next instr.
            c_debuggerBailOutKindForCall);
    }
}